

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

void __thiscall Liby::Buffer::append(Buffer *this,char *buf,off_t len)

{
  bool bVar1;
  off_t oVar2;
  off_t oVar3;
  off_t minSize;
  Buffer buffer;
  off_t len_local;
  char *buf_local;
  Buffer *this_local;
  
  buffer.capacity_ = len;
  if (buf == (char *)0x0 || len < 1) {
    __assert_fail("buf && len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0x6e,"void Liby::Buffer::append(const char *, off_t)");
  }
  bVar1 = empty(this);
  oVar3 = buffer.capacity_;
  if (bVar1) {
    Buffer((Buffer *)&minSize,buf,buffer.capacity_);
    swap(this,(Buffer *)&minSize);
    ~Buffer((Buffer *)&minSize);
  }
  else {
    if (this->capacity_ - this->rightIndex_ < buffer.capacity_) {
      oVar2 = size(this);
      if (this->capacity_ < oVar3 + oVar2) {
        oVar3 = size(this);
        reserve(this,oVar3 + buffer.capacity_ + this->leftIndex_);
      }
      else {
        forward(this,0);
      }
    }
    safeAppend(this,buf,buffer.capacity_);
  }
  return;
}

Assistant:

void Buffer::append(const char *buf, off_t len) {
    assert(buf && len > 0);
    if(empty()) {
        Buffer buffer(buf, len);
        swap(buffer);
        return;
    }
    if (capacity_ - rightIndex_ >= len) {
        ;
    } else if (len + size() <= capacity_) {
        forward();
    } else {
        off_t minSize = size() + len + leftIndex_;
        reserve(minSize);
    }
    safeAppend(buf, len);
}